

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueueReader.hpp
# Opt level: O2

ReadResult * __thiscall
binlog::detail::QueueReader::beginRead(ReadResult *__return_storage_ptr__,QueueReader *this)

{
  ulong uVar1;
  Queue *pQVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  
  uVar1 = (this->_queue->writeIndex).super___atomic_base<unsigned_long>._M_i;
  pQVar2 = this->_queue;
  uVar3 = (pQVar2->readIndex).super___atomic_base<unsigned_long>._M_i;
  this->_readEnd = uVar1;
  if (uVar1 < uVar3) {
    pcVar4 = pQVar2->buffer;
    sVar5 = pQVar2->dataEnd - uVar3;
    if (uVar3 <= pQVar2->dataEnd && sVar5 != 0) {
      __return_storage_ptr__->buffer1 = pcVar4 + uVar3;
      __return_storage_ptr__->size1 = sVar5;
      __return_storage_ptr__->buffer2 = pcVar4;
      __return_storage_ptr__->size2 = uVar1;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->buffer1 = pcVar4;
    __return_storage_ptr__->size1 = uVar1;
  }
  else {
    __return_storage_ptr__->buffer1 = pQVar2->buffer + uVar3;
    __return_storage_ptr__->size1 = uVar1 - uVar3;
  }
  __return_storage_ptr__->buffer2 = (char *)0x0;
  __return_storage_ptr__->size2 = 0;
  return __return_storage_ptr__;
}

Assistant:

ReadResult beginRead()
  {
    const std::size_t w = _queue->writeIndex.load(std::memory_order_acquire);
    const std::size_t r = _queue->readIndex.load(std::memory_order_relaxed);

    _readEnd = w;

    if (r <= w)  // [...R######W...]
    {
      return ReadResult{buffer() + r, w - r, nullptr, 0};
    }

    if (r < _queue->dataEnd)  // [###W...R###E..]
    {
      return ReadResult{
        buffer() + r, _queue->dataEnd - r,
        buffer(), w
      };
    }

    // [###W......RE..]
    return ReadResult{buffer(), w, nullptr, 0};
  }